

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O1

unique_ptr<Entry<ON_SimpleArray<unsigned_char>_>,_std::default_delete<Entry<ON_SimpleArray<unsigned_char>_>_>_>
 make_entry<ON_SimpleArray<unsigned_char>>(ON_SimpleArray<unsigned_char> *value)

{
  _func_int **pp_Var1;
  ON_SimpleArray<unsigned_char> *in_RSI;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  *pp_Var1 = (_func_int *)&PTR__DictionaryEntryT_00818a60;
  pp_Var1[1] = (_func_int *)&PTR__ON_SimpleArray_00818aa0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  ON_SimpleArray<unsigned_char>::operator=((ON_SimpleArray<unsigned_char> *)(pp_Var1 + 1),in_RSI);
  *pp_Var1 = (_func_int *)&PTR__DictionaryEntryT_008189f0;
  value->_vptr_ON_SimpleArray = pp_Var1;
  return (__uniq_ptr_data<Entry<ON_SimpleArray<unsigned_char>_>,_std::default_delete<Entry<ON_SimpleArray<unsigned_char>_>_>,_true,_true>
          )(__uniq_ptr_data<Entry<ON_SimpleArray<unsigned_char>_>,_std::default_delete<Entry<ON_SimpleArray<unsigned_char>_>_>,_true,_true>
            )value;
}

Assistant:

static std::unique_ptr<Entry<T>> make_entry(const T& value)
{
  return std::make_unique<Entry<T>>(value);
}